

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeVerifyPhaseOne(Gia_Man_t *p,Vec_Int_t *vAdds,int iBox)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *__format;
  int iVar12;
  ulong uVar13;
  
  if (-1 < iBox) {
    uVar10 = iBox * 6 + 2;
    if ((int)uVar10 < vAdds->nSize) {
      uVar4 = iBox * 6;
      iVar1 = vAdds->pArray[uVar10];
      uVar10 = uVar4 + 5;
      if (iVar1 < 1) {
        if ((uint)vAdds->nSize <= uVar10) goto LAB_00686661;
        uVar9 = (uint)vAdds->pArray[uVar10] >> 0x12 & 1;
      }
      else {
        uVar9 = 0;
      }
      Gia_ManIncrementTravId(p);
      uVar13 = (ulong)uVar4;
      puVar6 = &DAT_00a29b4c;
      lVar8 = 0;
      do {
        if (vAdds->nSize <= (int)(uVar4 + (int)lVar8)) goto LAB_00686661;
        piVar2 = vAdds->pArray;
        uVar5 = piVar2[uVar13 + lVar8];
        uVar11 = (ulong)uVar5;
        if (uVar11 != 0) {
          if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) goto LAB_00686680;
          if (vAdds->nSize <= (int)uVar10) goto LAB_00686661;
          uVar7 = ~*puVar6 & 0xff;
          if ((((uint)piVar2[uVar10] >> ((byte)((byte)lVar8 | 0x10) & 0x1f) & 1) != 0) == uVar9) {
            uVar7 = *puVar6;
          }
          p->pObjs[uVar11].Value = uVar7;
          if (p->nTravIdsAlloc <= (int)uVar5) {
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          p->pTravIds[uVar11] = p->nTravIds;
        }
        lVar8 = lVar8 + 1;
        puVar6 = puVar6 + 1;
      } while (lVar8 != 3);
      uVar4 = uVar4 + 3;
      if ((int)uVar4 < vAdds->nSize) {
        iVar12 = piVar2[uVar4];
        if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_00686680:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar5 = Acec_TreeVerifyPhaseOne_rec(p,p->pObjs + iVar12);
        if ((int)uVar10 < vAdds->nSize) {
          uVar7 = ~uVar5 & 0xff;
          if (((uint)vAdds->pArray[uVar10] >> 0x13 & 1) == uVar9) {
            uVar7 = uVar5;
          }
          iVar12 = vAdds->pArray[uVar13 + 4];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_00686680;
          uVar5 = Acec_TreeVerifyPhaseOne_rec(p,p->pObjs + iVar12);
          if ((int)uVar10 < vAdds->nSize) {
            piVar2 = vAdds->pArray;
            uVar3 = ~uVar5 & 0xff;
            if (((uint)piVar2[uVar10] >> 0x14 & 1) == uVar9) {
              uVar3 = uVar5;
            }
            iVar12 = (int)(uVar13 + 4);
            if (iVar1 < 1) {
              if (uVar7 != 0x66) {
                printf("Hadd %d sum %d is wrong.\n",iBox,(ulong)(uint)piVar2[uVar4]);
              }
              if (uVar3 == 0x88) {
                return;
              }
              if (iVar12 < vAdds->nSize) {
                __format = "Hadd %d carry %d is wrong.\n";
                goto LAB_00686641;
              }
            }
            else {
              if (uVar7 != 0x96) {
                printf("Fadd %d sum %d is wrong.\n",iBox,(ulong)(uint)piVar2[uVar4]);
              }
              if (uVar3 == 0xe8) {
                return;
              }
              if (iVar12 < vAdds->nSize) {
                __format = "Fadd %d carry %d is wrong.\n";
LAB_00686641:
                printf(__format,iBox,(ulong)(uint)vAdds->pArray[uVar13 + 4]);
                return;
              }
            }
          }
        }
      }
    }
  }
LAB_00686661:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acec_TreeVerifyPhaseOne( Gia_Man_t * p, Vec_Int_t * vAdds, int iBox )
{
    Gia_Obj_t * pObj;
    unsigned TruthXor, TruthMaj, Truths[3] = { 0xAA, 0xCC, 0xF0 };
    int k, iObj, fFadd = Vec_IntEntry(vAdds, 6*iBox+2) > 0;
    int fFlip = !fFadd && Acec_SignBit2(vAdds, iBox, 2);

    Gia_ManIncrementTravId( p );
    for ( k = 0; k < 3; k++ )
    {
        iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        pObj = Gia_ManObj( p, iObj );
        pObj->Value = (Acec_SignBit2(vAdds, iBox, k) ^ fFlip) ? 0xFF & ~Truths[k] : Truths[k];
        Gia_ObjSetTravIdCurrent( p, pObj );
    }

    iObj = Vec_IntEntry( vAdds, 6*iBox+3 );
    TruthXor = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthXor = (Acec_SignBit2(vAdds, iBox, 3) ^ fFlip) ? 0xFF & ~TruthXor : TruthXor;

    iObj = Vec_IntEntry( vAdds, 6*iBox+4 );
    TruthMaj = Acec_TreeVerifyPhaseOne_rec( p, Gia_ManObj(p, iObj) );
    TruthMaj = (Acec_SignBit2(vAdds, iBox, 4) ^ fFlip) ? 0xFF & ~TruthMaj : TruthMaj;

    if ( fFadd ) // FADD
    {
        if ( TruthXor != 0x96 )
            printf( "Fadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0xE8 )
            printf( "Fadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
    else
    {
        //printf( "Sign1 = %d%d%d %d\n", Acec_SignBit(vAdds, iBox, 0), Acec_SignBit(vAdds, iBox, 1), Acec_SignBit(vAdds, iBox, 2), Acec_SignBit(vAdds, iBox, 3) );
        //printf( "Sign2 = %d%d%d %d%d\n", Acec_SignBit2(vAdds, iBox, 0), Acec_SignBit2(vAdds, iBox, 1), Acec_SignBit2(vAdds, iBox, 2), Acec_SignBit2(vAdds, iBox, 3), Acec_SignBit2(vAdds, iBox, 4) );
        if ( TruthXor != 0x66 )
            printf( "Hadd %d sum %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+3 ) );
        if ( TruthMaj != 0x88 )
            printf( "Hadd %d carry %d is wrong.\n", iBox, Vec_IntEntry( vAdds, 6*iBox+4 ) );
    }
}